

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipc.c
# Opt level: O2

void nn_cipc_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  nn_queue_item *self_00;
  int iVar1;
  
  if (type == -3 && src == -2) {
    self_00 = &self[10].stopped.item;
    iVar1 = nn_sipc_isidle((nn_sipc *)self_00);
    if (iVar1 == 0) {
      nn_ep_stat_increment((nn_ep *)self[1].shutdown_fn,0x67,1);
      nn_sipc_stop((nn_sipc *)self_00);
    }
    *(undefined4 *)&self[1].fn = 8;
  }
  else {
    if (*(int *)&self[1].fn == 9) goto LAB_0012dc77;
    if (*(int *)&self[1].fn != 8) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
              (ulong)*(uint *)&self[1].fn,(ulong)(uint)src,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ipc/cipc.c"
              ,0xb5);
      fflush(_stderr);
      nn_err_abort();
    }
  }
  iVar1 = nn_sipc_isidle((nn_sipc *)&self[10].stopped.item);
  if (iVar1 == 0) {
    return;
  }
  nn_backoff_stop((nn_backoff *)&self[8].shutdown_fn);
  nn_usock_stop((nn_usock *)&self[1].state);
  *(undefined4 *)&self[1].fn = 9;
LAB_0012dc77:
  iVar1 = nn_backoff_isidle((nn_backoff *)&self[8].shutdown_fn);
  if ((iVar1 != 0) && (iVar1 = nn_usock_isidle((nn_usock *)&self[1].state), iVar1 != 0)) {
    *(undefined4 *)&self[1].fn = 1;
    nn_fsm_stopped_noevent(self);
    nn_ep_stopped((nn_ep *)self[1].shutdown_fn);
    return;
  }
  return;
}

Assistant:

static void nn_cipc_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_cipc *cipc;

    cipc = nn_cont (self, struct nn_cipc, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        if (!nn_sipc_isidle (&cipc->sipc)) {
            nn_ep_stat_increment (cipc->ep, NN_STAT_DROPPED_CONNECTIONS, 1);
            nn_sipc_stop (&cipc->sipc);
        }
        cipc->state = NN_CIPC_STATE_STOPPING_SIPC_FINAL;
    }
    if (nn_slow (cipc->state == NN_CIPC_STATE_STOPPING_SIPC_FINAL)) {
        if (!nn_sipc_isidle (&cipc->sipc))
            return;
        nn_backoff_stop (&cipc->retry);
        nn_usock_stop (&cipc->usock);
        cipc->state = NN_CIPC_STATE_STOPPING;
    }
    if (nn_slow (cipc->state == NN_CIPC_STATE_STOPPING)) {
        if (!nn_backoff_isidle (&cipc->retry) ||
              !nn_usock_isidle (&cipc->usock))
            return;
        cipc->state = NN_CIPC_STATE_IDLE;
        nn_fsm_stopped_noevent (&cipc->fsm);
        nn_ep_stopped (cipc->ep);
        return;
    }

    nn_fsm_bad_state(cipc->state, src, type);
}